

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<long>::Set(RepeatedField<long> *this,int index,long *value)

{
  long lVar1;
  LogMessage *pLVar2;
  long *plVar3;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29b);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29c);
    pLVar2 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_99,pLVar2);
    internal::LogMessage::~LogMessage(&local_98);
  }
  lVar1 = *value;
  plVar3 = elements(this);
  plVar3[index] = lVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}